

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_21daf9::PKDescriptor::MakeScripts
          (vector<CScript,_std::allocator<CScript>_> *__return_storage_ptr__,PKDescriptor *this,
          vector<CPubKey,_std::allocator<CPubKey>_> *keys,Span<const_CScript> param_2,
          FlatSigningProvider *param_3)

{
  CScript *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  long in_FS_OFFSET;
  CScript script;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  XOnlyPubKey local_78;
  undefined1 local_58 [32];
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_xonly == true) {
    local_58._16_8_ = 0;
    local_58._24_8_ = 0;
    local_58._0_8_ = (char *)0x0;
    local_58._8_8_ = 0;
    XOnlyPubKey::XOnlyPubKey
              (&local_78,
               (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
               super__Vector_impl_data._M_start);
    ToByteVector<XOnlyPubKey>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90,&local_78);
    this_00 = CScript::operator<<((CScript *)local_58,
                                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90
                                 );
    other = &CScript::operator<<(this_00,OP_CHECKSIG)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector(&local_38,other);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_90);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58);
    Vector<CScript>(__return_storage_ptr__,(CScript *)&local_38);
  }
  else {
    GetScriptForRawPubKey
              ((CScript *)&local_38,
               (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
               super__Vector_impl_data._M_start);
    Vector<CScript>(__return_storage_ptr__,(CScript *)&local_38);
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>& keys, Span<const CScript>, FlatSigningProvider&) const override
    {
        if (m_xonly) {
            CScript script = CScript() << ToByteVector(XOnlyPubKey(keys[0])) << OP_CHECKSIG;
            return Vector(std::move(script));
        } else {
            return Vector(GetScriptForRawPubKey(keys[0]));
        }
    }